

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O3

void andres::marray_detail::
     operate<andres::marray_detail::PrefixDecrement<int>,int,std::allocator<unsigned_long>>
               (View<int,_false,_std::allocator<unsigned_long>_> *v)

{
  bool bVar1;
  reference piVar2;
  int *piVar3;
  size_t sVar4;
  reference piVar5;
  runtime_error *this;
  size_t sVar6;
  ulong uVar7;
  iterator it;
  Iterator<int,_false,_std::allocator<unsigned_long>_> local_48;
  
  View<int,_false,_std::allocator<unsigned_long>_>::testInvariant(v);
  if ((v->geometry_).isSimple_ == true) {
    local_48.view_._0_4_ = 0;
    piVar2 = AccessOperatorHelper<true>::execute<int,int,false,std::allocator<unsigned_long>>
                       (v,(int *)&local_48);
    sVar4 = (v->geometry_).size_;
    if (sVar4 == 0) {
      return;
    }
    sVar6 = 0;
    do {
      piVar2[sVar6] = piVar2[sVar6] + -1;
      sVar6 = sVar6 + 1;
    } while (sVar4 != sVar6);
    return;
  }
  if (v->data_ == (pointer)0x0) {
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this,"Assertion failed.");
    __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  switch((v->geometry_).dimension_) {
  case 1:
    local_48.view_._0_4_ = 0;
    piVar3 = AccessOperatorHelper<true>::execute<int,int,false,std::allocator<unsigned_long>>
                       (v,(int *)&local_48);
    sVar4 = View<int,_false,_std::allocator<unsigned_long>_>::shape(v,0);
    if (sVar4 != 0) {
      uVar7 = 0;
      do {
        *piVar3 = *piVar3 + -1;
        sVar4 = View<int,_false,_std::allocator<unsigned_long>_>::strides(v,0);
        piVar3 = piVar3 + sVar4;
        uVar7 = uVar7 + 1;
        sVar4 = View<int,_false,_std::allocator<unsigned_long>_>::shape(v,0);
      } while (uVar7 < sVar4);
    }
    View<int,_false,_std::allocator<unsigned_long>_>::shape(v,0);
    sVar4 = 0;
    goto LAB_00116274;
  case 2:
    local_48.view_._0_4_ = 0;
    piVar2 = AccessOperatorHelper<true>::execute<int,int,false,std::allocator<unsigned_long>>
                       (v,(int *)&local_48);
    OperateHelperUnary<(unsigned_short)2,_andres::marray_detail::PrefixDecrement<int>,_int,_std::allocator<unsigned_long>_>
    ::operate(v,piVar2);
    break;
  case 3:
    local_48.view_._0_4_ = 0;
    piVar2 = AccessOperatorHelper<true>::execute<int,int,false,std::allocator<unsigned_long>>
                       (v,(int *)&local_48);
    sVar4 = View<int,_false,_std::allocator<unsigned_long>_>::shape(v,2);
    if (sVar4 != 0) {
      uVar7 = 0;
      do {
        OperateHelperUnary<(unsigned_short)2,_andres::marray_detail::PrefixDecrement<int>,_int,_std::allocator<unsigned_long>_>
        ::operate(v,piVar2);
        sVar4 = View<int,_false,_std::allocator<unsigned_long>_>::strides(v,2);
        piVar2 = piVar2 + sVar4;
        uVar7 = uVar7 + 1;
        sVar4 = View<int,_false,_std::allocator<unsigned_long>_>::shape(v,2);
      } while (uVar7 < sVar4);
    }
    View<int,_false,_std::allocator<unsigned_long>_>::shape(v,2);
    sVar4 = 2;
LAB_00116274:
    View<int,_false,_std::allocator<unsigned_long>_>::strides(v,sVar4);
    break;
  case 4:
    local_48.view_._0_4_ = 0;
    piVar2 = AccessOperatorHelper<true>::execute<int,int,false,std::allocator<unsigned_long>>
                       (v,(int *)&local_48);
    OperateHelperUnary<(unsigned_short)4,_andres::marray_detail::PrefixDecrement<int>,_int,_std::allocator<unsigned_long>_>
    ::operate(v,piVar2);
    break;
  case 5:
    local_48.view_._0_4_ = 0;
    piVar2 = AccessOperatorHelper<true>::execute<int,int,false,std::allocator<unsigned_long>>
                       (v,(int *)&local_48);
    OperateHelperUnary<(unsigned_short)5,_andres::marray_detail::PrefixDecrement<int>,_int,_std::allocator<unsigned_long>_>
    ::operate(v,piVar2);
    break;
  default:
    sVar4 = View<int,_false,_std::allocator<unsigned_long>_>::dimension(v);
    if (sVar4 == 6) {
      local_48.view_._0_4_ = 0;
      piVar2 = AccessOperatorHelper<true>::execute<int,int,false,std::allocator<unsigned_long>>
                         (v,(int *)&local_48);
      OperateHelperUnary<(unsigned_short)6,_andres::marray_detail::PrefixDecrement<int>,_int,_std::allocator<unsigned_long>_>
      ::operate(v,piVar2);
    }
    else {
      sVar4 = View<int,_false,_std::allocator<unsigned_long>_>::dimension(v);
      if (sVar4 == 7) {
        local_48.view_._0_4_ = 0;
        piVar2 = AccessOperatorHelper<true>::execute<int,int,false,std::allocator<unsigned_long>>
                           (v,(int *)&local_48);
        OperateHelperUnary<(unsigned_short)7,_andres::marray_detail::PrefixDecrement<int>,_int,_std::allocator<unsigned_long>_>
        ::operate(v,piVar2);
      }
      else {
        sVar4 = View<int,_false,_std::allocator<unsigned_long>_>::dimension(v);
        if (sVar4 == 8) {
          local_48.view_._0_4_ = 0;
          piVar2 = AccessOperatorHelper<true>::execute<int,int,false,std::allocator<unsigned_long>>
                             (v,(int *)&local_48);
          OperateHelperUnary<(unsigned_short)8,_andres::marray_detail::PrefixDecrement<int>,_int,_std::allocator<unsigned_long>_>
          ::operate(v,piVar2);
        }
        else {
          sVar4 = View<int,_false,_std::allocator<unsigned_long>_>::dimension(v);
          if (sVar4 == 9) {
            local_48.view_._0_4_ = 0;
            piVar2 = AccessOperatorHelper<true>::
                     execute<int,int,false,std::allocator<unsigned_long>>(v,(int *)&local_48);
            OperateHelperUnary<(unsigned_short)9,_andres::marray_detail::PrefixDecrement<int>,_int,_std::allocator<unsigned_long>_>
            ::operate(v,piVar2);
          }
          else {
            sVar4 = View<int,_false,_std::allocator<unsigned_long>_>::dimension(v);
            if (sVar4 == 10) {
              local_48.view_._0_4_ = 0;
              piVar2 = AccessOperatorHelper<true>::
                       execute<int,int,false,std::allocator<unsigned_long>>(v,(int *)&local_48);
              OperateHelperUnary<(unsigned_short)10,_andres::marray_detail::PrefixDecrement<int>,_int,_std::allocator<unsigned_long>_>
              ::operate(v,piVar2);
            }
            else {
              View<int,_false,_std::allocator<unsigned_long>_>::testInvariant(v);
              Iterator<int,_false,_std::allocator<unsigned_long>_>::Iterator(&local_48,v,0);
              while (bVar1 = Iterator<int,_false,_std::allocator<unsigned_long>_>::hasMore
                                       (&local_48), bVar1) {
                piVar5 = Iterator<int,_false,_std::allocator<unsigned_long>_>::operator*(&local_48);
                *piVar5 = *piVar5 + -1;
                Iterator<int,_false,_std::allocator<unsigned_long>_>::operator++(&local_48);
              }
              if (local_48.coordinates_.
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_48.coordinates_.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start,
                                (long)local_48.coordinates_.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)local_48.coordinates_.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

inline void 
operate
(
    View<T, false, A>& v, 
    Functor f
)
{
    if(v.isSimple()) {
        T* data = &v(0);
        for(std::size_t j=0; j<v.size(); ++j) {
            f(data[j]);
        }
    }
    else if(v.dimension() == 1)
        OperateHelperUnary<1, Functor, T, A>::operate(v, f, &v(0));
    else if(v.dimension() == 2)
        OperateHelperUnary<2, Functor, T, A>::operate(v, f, &v(0));
    else if(v.dimension() == 3)
        OperateHelperUnary<3, Functor, T, A>::operate(v, f, &v(0));
    else if(v.dimension() == 4)
        OperateHelperUnary<4, Functor, T, A>::operate(v, f, &v(0));
    else if(v.dimension() == 5)
        OperateHelperUnary<5, Functor, T, A>::operate(v, f, &v(0));
    else if(v.dimension() == 6)
        OperateHelperUnary<6, Functor, T, A>::operate(v, f, &v(0));
    else if(v.dimension() == 7)
        OperateHelperUnary<7, Functor, T, A>::operate(v, f, &v(0));
    else if(v.dimension() == 8)
        OperateHelperUnary<8, Functor, T, A>::operate(v, f, &v(0));
    else if(v.dimension() == 9)
        OperateHelperUnary<9, Functor, T, A>::operate(v, f, &v(0));
    else if(v.dimension() == 10)
        OperateHelperUnary<10, Functor, T, A>::operate(v, f, &v(0));
    else {
        for(typename View<T, false, A>::iterator it = v.begin(); it.hasMore(); ++it) {
            f(*it);
        }
    }
}